

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclSize.h
# Opt level: O0

void Abc_SclManFree(SC_Man *p)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  int local_1c;
  int i;
  Abc_Obj_t *pObj;
  SC_Man *p_local;
  
  for (local_1c = 0; iVar1 = Abc_NtkCiNum(p->pNtk), local_1c < iVar1; local_1c = local_1c + 1) {
    pAVar2 = Abc_NtkCi(p->pNtk,local_1c);
    (pAVar2->field_5).iData = 0;
  }
  for (local_1c = 0; iVar1 = Abc_NtkCoNum(p->pNtk), local_1c < iVar1; local_1c = local_1c + 1) {
    pAVar2 = Abc_NtkCo(p->pNtk,local_1c);
    (pAVar2->field_5).iData = 0;
  }
  p->pNtk->pSCLib = (void *)0x0;
  Vec_IntFreeP(&p->pNtk->vGates);
  Vec_IntFreeP(&p->vNodeIter);
  Vec_QueFreeP(&p->vNodeByGain);
  Vec_FltFreeP(&p->vNode2Gain);
  Vec_IntFreeP(&p->vNode2Gate);
  Vec_FltFreeP(&p->vLoads2);
  Vec_FltFreeP(&p->vLoads3);
  Vec_FltFreeP(&p->vTimes2);
  Vec_FltFreeP(&p->vTimes3);
  Vec_IntFreeP(&p->vUpdates);
  Vec_IntFreeP(&p->vUpdates2);
  Vec_IntFreeP(&p->vGatesBest);
  Vec_WecFreeP(&p->vLevels);
  Vec_IntFreeP(&p->vChanged);
  Vec_QueCheck(p->vQue);
  Vec_QueFreeP(&p->vQue);
  Vec_FltFreeP(&p->vTimesOut);
  Vec_IntFreeP(&p->vBestFans);
  Vec_FltFreeP(&p->vInDrive);
  Vec_FltFreeP(&p->vWireCaps);
  if (p->pLoads != (SC_Pair *)0x0) {
    free(p->pLoads);
    p->pLoads = (SC_Pair *)0x0;
  }
  if (p->pDepts != (SC_Pair *)0x0) {
    free(p->pDepts);
    p->pDepts = (SC_Pair *)0x0;
  }
  if (p->pTimes != (SC_Pair *)0x0) {
    free(p->pTimes);
    p->pTimes = (SC_Pair *)0x0;
  }
  if (p->pSlews != (SC_Pair *)0x0) {
    free(p->pSlews);
    p->pSlews = (SC_Pair *)0x0;
  }
  if (p != (SC_Man *)0x0) {
    free(p);
  }
  return;
}

Assistant:

static inline void Abc_SclManFree( SC_Man * p )
{
    Abc_Obj_t * pObj;
    int i;
    // set CI/CO ids
    Abc_NtkForEachCi( p->pNtk, pObj, i )
        pObj->iData = 0;
    Abc_NtkForEachCo( p->pNtk, pObj, i )
        pObj->iData = 0;
    // other
    p->pNtk->pSCLib = NULL;
    Vec_IntFreeP( &p->pNtk->vGates );
    Vec_IntFreeP( &p->vNodeIter );
    Vec_QueFreeP( &p->vNodeByGain );
    Vec_FltFreeP( &p->vNode2Gain );
    Vec_IntFreeP( &p->vNode2Gate );
    // intermediate data
    Vec_FltFreeP( &p->vLoads2 );
    Vec_FltFreeP( &p->vLoads3 );
    Vec_FltFreeP( &p->vTimes2 );
    Vec_FltFreeP( &p->vTimes3 );
    Vec_IntFreeP( &p->vUpdates );
    Vec_IntFreeP( &p->vUpdates2 );
    Vec_IntFreeP( &p->vGatesBest );
    Vec_WecFreeP( &p->vLevels );
    Vec_IntFreeP( &p->vChanged );
//    Vec_QuePrint( p->vQue );
    Vec_QueCheck( p->vQue );
    Vec_QueFreeP( &p->vQue );
    Vec_FltFreeP( &p->vTimesOut );
    Vec_IntFreeP( &p->vBestFans );
    Vec_FltFreeP( &p->vInDrive );
    Vec_FltFreeP( &p->vWireCaps );
    ABC_FREE( p->pLoads );
    ABC_FREE( p->pDepts );
    ABC_FREE( p->pTimes );
    ABC_FREE( p->pSlews );
    ABC_FREE( p );
}